

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlChar * xmlParseAttValueInternal(xmlParserCtxtPtr ctxt,int *len,int *alloc,int normalize)

{
  byte bVar1;
  xmlChar xVar2;
  bool bVar3;
  bool bVar4;
  int *piVar5;
  byte *pbVar6;
  uint uVar7;
  xmlParserInputPtr pxVar8;
  xmlChar *pxVar9;
  xmlChar *pxVar10;
  xmlEntityPtr pxVar11;
  unsigned_long uVar12;
  xmlChar *pxVar13;
  xmlChar *pxVar14;
  byte bVar15;
  xmlParserInputState xVar16;
  ulong uVar17;
  byte *pbVar18;
  char *msg;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  xmlParserErrors error;
  long lVar22;
  int iVar23;
  byte *cur;
  byte *pbVar24;
  byte *pbVar25;
  size_t sVar26;
  ulong uVar27;
  xmlChar xVar28;
  long lVar29;
  byte *local_60;
  int local_54;
  ulong local_50;
  int local_44;
  int *local_40;
  long local_38;
  
  uVar7 = 1000000000;
  if ((ctxt->options & 0x80000) == 0) {
    uVar7 = 10000000;
  }
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  pxVar8 = ctxt->input;
  pbVar24 = pxVar8->cur;
  iVar23 = pxVar8->line;
  if ((*pbVar24 == 0x22) || (*pbVar24 == 0x27)) {
    iVar19 = pxVar8->col;
    ctxt->instate = XML_PARSER_ATTRIBUTE_VALUE;
    cur = pbVar24 + 1;
    bVar1 = *pbVar24;
    pbVar18 = pxVar8->end;
    xVar16 = XML_PARSER_ATTRIBUTE_VALUE;
    local_40 = len;
    if (pbVar18 <= cur) {
      pxVar9 = pxVar8->base;
      if (((long)pbVar18 - (long)pbVar24 < 0xfa) && (ctxt->progressive == 0)) {
        xmlGROW(ctxt);
        xVar16 = ctxt->instate;
        if (xVar16 == XML_PARSER_EOF) {
          return (xmlChar *)0x0;
        }
      }
      pxVar8 = ctxt->input;
      pbVar18 = pxVar8->end;
      lVar22 = (long)pxVar8->base - (long)pxVar9;
      lVar29 = 0;
      if (lVar22 != 0) {
        lVar29 = lVar22;
      }
      cur = cur + lVar29;
    }
    iVar19 = iVar19 + 1;
    if (normalize == 0) {
      pbVar24 = cur;
      while ((((pbVar24 < pbVar18 && (bVar15 = *pbVar24, '\x1f' < (char)bVar15 && bVar15 != bVar1))
              && (bVar15 != 0x26)) && (bVar15 != 0x3c))) {
        pbVar24 = pbVar24 + 1;
        if (pbVar18 <= pbVar24) {
          pxVar9 = pxVar8->base;
          if ((ctxt->progressive == 0) && ((long)pxVar8->end - (long)pxVar8->cur < 0xfa)) {
            xmlGROW(ctxt);
            xVar16 = ctxt->instate;
          }
          if (xVar16 == XML_PARSER_EOF) {
            return (xmlChar *)0x0;
          }
          pxVar8 = ctxt->input;
          lVar22 = (long)pxVar8->base - (long)pxVar9;
          lVar29 = 0;
          if (lVar22 != 0) {
            lVar29 = lVar22;
          }
          cur = cur + lVar29;
          pbVar24 = pbVar24 + lVar29;
          if ((long)(ulong)uVar7 < (long)pbVar24 - (long)cur) goto LAB_00158fc5;
          pbVar18 = pxVar8->end;
        }
        iVar19 = iVar19 + 1;
      }
      if ((long)pbVar24 - (long)cur <= (long)(ulong)uVar7) {
        bVar15 = *pbVar24;
        pbVar25 = pbVar24;
        goto joined_r0x00158fe2;
      }
    }
    else {
      if (cur < pbVar18) {
        do {
          if (((*cur == bVar1) || (uVar21 = (uint)*cur, 0x20 < uVar21)) ||
             ((0x100002600U >> ((ulong)uVar21 & 0x3f) & 1) == 0)) break;
          iVar19 = iVar19 + 1;
          if (uVar21 == 10) {
            iVar19 = 1;
          }
          cur = cur + 1;
          if (pbVar18 <= cur) {
            local_50 = CONCAT44(local_50._4_4_,iVar19);
            pxVar9 = pxVar8->base;
            if ((ctxt->progressive == 0) && ((long)pxVar8->end - (long)pxVar8->cur < 0xfa)) {
              xmlGROW(ctxt);
              xVar16 = ctxt->instate;
            }
            if (xVar16 == XML_PARSER_EOF) {
              return (xmlChar *)0x0;
            }
            pxVar8 = ctxt->input;
            pbVar18 = pxVar8->end;
            lVar22 = (long)pxVar8->base - (long)pxVar9;
            lVar29 = 0;
            if (lVar22 != 0) {
              lVar29 = lVar22;
            }
            cur = cur + lVar29;
            iVar19 = (int)local_50;
          }
          iVar23 = iVar23 + (uint)(uVar21 == 10);
        } while (cur < pbVar18);
      }
      local_50 = (ulong)uVar7;
      pbVar24 = cur;
      while ((((pbVar6 = pbVar24, pbVar24 < pbVar18 &&
               (bVar15 = *pbVar24, '\x1f' < (char)bVar15 && bVar15 != bVar1)) && (bVar15 != 0x26))
             && (bVar15 != 0x3c))) {
        iVar19 = iVar19 + 1;
        pbVar24 = pbVar24 + 1;
        if ((bVar15 == 0x20) && (pbVar6 = pbVar24, *pbVar24 == 0x20)) break;
        if (pbVar18 <= pbVar24) {
          pxVar9 = pxVar8->base;
          if ((ctxt->progressive == 0) && ((long)pxVar8->end - (long)pxVar8->cur < 0xfa)) {
            xmlGROW(ctxt);
            xVar16 = ctxt->instate;
          }
          if (xVar16 == XML_PARSER_EOF) {
            return (xmlChar *)0x0;
          }
          pxVar8 = ctxt->input;
          lVar22 = (long)pxVar8->base - (long)pxVar9;
          lVar29 = 0;
          if (lVar22 != 0) {
            lVar29 = lVar22;
          }
          cur = cur + lVar29;
          pbVar24 = pbVar24 + lVar29;
          if ((long)local_50 < (long)pbVar24 - (long)cur) goto LAB_00158fc5;
          pbVar18 = pxVar8->end;
        }
      }
      do {
        pbVar25 = pbVar6;
        if (pbVar25[-1] != 0x20) break;
        pbVar6 = pbVar25 + -1;
      } while (cur < pbVar25);
      if (pbVar24 < pbVar18) {
        do {
          if (((*pbVar24 == bVar1) || (uVar7 = (uint)*pbVar24, 0x20 < uVar7)) ||
             ((0x100002600U >> ((ulong)uVar7 & 0x3f) & 1) == 0)) break;
          iVar19 = iVar19 + 1;
          if (uVar7 == 10) {
            iVar19 = 1;
          }
          pbVar24 = pbVar24 + 1;
          if (pbVar18 <= pbVar24) {
            pxVar9 = pxVar8->base;
            if ((ctxt->progressive == 0) && ((long)pxVar8->end - (long)pxVar8->cur < 0xfa)) {
              xmlGROW(ctxt);
              xVar16 = ctxt->instate;
            }
            if (xVar16 == XML_PARSER_EOF) {
              return (xmlChar *)0x0;
            }
            pxVar8 = ctxt->input;
            lVar22 = (long)pxVar8->base - (long)pxVar9;
            lVar29 = 0;
            if (lVar22 != 0) {
              lVar29 = lVar22;
            }
            cur = cur + lVar29;
            pbVar24 = pbVar24 + lVar29;
            if ((long)local_50 < (long)pbVar24 - (long)cur) goto LAB_00158fc5;
            pbVar18 = pxVar8->end;
            pbVar25 = pbVar25 + lVar29;
          }
          iVar23 = iVar23 + (uint)(uVar7 == 10);
        } while (pbVar24 < pbVar18);
      }
      if ((long)pbVar24 - (long)cur <= (long)local_50) {
        bVar15 = *pbVar24;
joined_r0x00158fe2:
        if (bVar15 == bVar1) {
          if (local_40 == (int *)0x0) {
            if (alloc != (int *)0x0) {
              *alloc = 1;
            }
            cur = xmlStrndup(cur,(int)pbVar25 - (int)cur);
            pxVar8 = ctxt->input;
          }
          else {
            if (alloc != (int *)0x0) {
              *alloc = 0;
            }
            *local_40 = (int)pbVar25 - (int)cur;
          }
          pxVar8->cur = pbVar24 + 1;
          pxVar8->line = iVar23;
          pxVar8->col = iVar19 + 1;
          return cur;
        }
        if (alloc != (int *)0x0) {
          *alloc = 1;
        }
        local_50 = 1000000000;
        if (((uint)ctxt->options >> 0x13 & 1) == 0) {
          local_50 = 10000000;
        }
        xVar28 = *pxVar8->cur;
        if (xVar28 == '\"') {
LAB_00159031:
          ctxt->instate = XML_PARSER_ATTRIBUTE_VALUE;
          xmlNextChar(ctxt);
          sVar26 = 100;
          pxVar9 = (xmlChar *)(*xmlMallocAtomic)(100);
          if (pxVar9 == (xmlChar *)0x0) {
            pxVar9 = (xmlChar *)0x0;
          }
          else {
            uVar7 = xmlCurrentChar(ctxt,&local_54);
            bVar3 = false;
            uVar20 = 0;
            do {
              piVar5 = local_40;
              local_60 = (byte *)0x0;
              pxVar10 = ctxt->input->cur;
              if (xVar28 == *pxVar10) {
LAB_001597dc:
                if (ctxt->instate == XML_PARSER_EOF) {
LAB_0015980e:
                  local_60 = (byte *)0x0;
                  goto LAB_001597b5;
                }
                if (((normalize == 0) || (!bVar3)) || (uVar20 == 0)) goto LAB_00159839;
                goto LAB_001597fd;
              }
              if (0xff < (int)uVar7) {
                if ((0xffefffff < uVar7 - 0x110000 || 0xffffe001 < uVar7 - 0xfffe) || uVar7 < 0xd800
                   ) goto LAB_0015910c;
                goto LAB_001597dc;
              }
              if ((int)uVar7 < 0x20) {
                if ((0xd < uVar7) || ((0x2600U >> (uVar7 & 0x1f) & 1) == 0)) goto LAB_001597dc;
              }
              else if (uVar7 == 0x3c) goto LAB_001597dc;
LAB_0015910c:
              if (ctxt->instate == XML_PARSER_EOF) goto LAB_0015980e;
              if (uVar7 < 0x27) {
                if ((0x100002600U >> ((ulong)uVar7 & 0x3f) & 1) != 0) {
                  if ((normalize == 0) || (uVar20 != 0)) {
                    bVar4 = !bVar3;
                    bVar3 = true;
                    if (normalize == 0 || bVar4) {
                      if (local_54 == 1) {
                        pxVar9[uVar20] = ' ';
                        uVar20 = uVar20 + 1;
                      }
                      else {
                        iVar23 = xmlCopyCharMultiByte(pxVar9 + uVar20,0x20);
                        uVar20 = uVar20 + (long)iVar23;
                      }
                      pxVar10 = pxVar9;
                      while (pxVar9 = pxVar10, sVar26 < uVar20 + 10) {
                        uVar17 = sVar26 * 2 + 10;
                        if ((uVar17 < sVar26) ||
                           (pxVar10 = (xmlChar *)(*xmlRealloc)(pxVar9,uVar17), sVar26 = uVar17,
                           pxVar10 == (xmlChar *)0x0)) goto LAB_001597a6;
                      }
                    }
                  }
                  else {
                    uVar20 = 0;
                  }
                  goto LAB_00159394;
                }
                if ((ulong)uVar7 != 0x26) goto LAB_001591e5;
                if (pxVar10[1] == '#') {
                  iVar23 = xmlParseCharRef(ctxt);
                  if (iVar23 != 0) {
                    uVar17 = uVar20 + 10;
                    if (iVar23 == 0x26) {
                      pxVar10 = pxVar9;
                      if (ctxt->replaceEntities == 0) {
                        if (sVar26 < uVar17) {
                          sVar26 = sVar26 * 2 + 10;
                          pxVar10 = (xmlChar *)(*xmlRealloc)(pxVar9,sVar26);
                          if (pxVar10 == (xmlChar *)0x0) goto LAB_001597a6;
                        }
                        builtin_memcpy(pxVar10 + uVar20,"&#38;",5);
                        uVar20 = uVar20 + 5;
                      }
                      else {
                        if (sVar26 < uVar17) {
                          sVar26 = sVar26 * 2 + 10;
                          pxVar10 = (xmlChar *)(*xmlRealloc)(pxVar9,sVar26);
                          if (pxVar10 == (xmlChar *)0x0) goto LAB_001597a6;
                        }
                        pxVar10[uVar20] = '&';
                        uVar20 = uVar20 + 1;
                      }
                      bVar3 = false;
                      pxVar9 = pxVar10;
                      goto LAB_001593c2;
                    }
                    pxVar10 = pxVar9;
                    if (sVar26 < uVar17) {
                      sVar26 = sVar26 * 2 + 10;
                      pxVar10 = (xmlChar *)(*xmlRealloc)(pxVar9,sVar26);
                      if (pxVar10 == (xmlChar *)0x0) goto LAB_001598f0;
                    }
                    iVar23 = xmlCopyChar(0,pxVar10 + uVar20,iVar23);
                    uVar20 = uVar20 + (long)iVar23;
                    pxVar9 = pxVar10;
                  }
                  bVar3 = false;
                }
                else {
                  pxVar11 = xmlParseEntityRef(ctxt);
                  uVar12 = ctxt->nbentities + 1;
                  ctxt->nbentities = uVar12;
                  if (pxVar11 != (xmlEntityPtr)0x0) {
                    ctxt->nbentities = uVar12 + (long)pxVar11->owner;
                    if (pxVar11->etype == XML_INTERNAL_PREDEFINED_ENTITY) {
                      pxVar10 = pxVar9;
                      if (sVar26 < uVar20 + 10) {
                        sVar26 = sVar26 * 2 + 10;
                        pxVar10 = (xmlChar *)(*xmlRealloc)(pxVar9,sVar26);
                        if (pxVar10 == (xmlChar *)0x0) goto LAB_001597a6;
                      }
                      pxVar9 = pxVar10;
                      if (*pxVar11->content == '&' && ctxt->replaceEntities == 0) {
                        builtin_memcpy(pxVar9 + uVar20,"&#38;",5);
                        uVar20 = uVar20 + 5;
                      }
                      else {
                        pxVar9[uVar20] = *pxVar11->content;
                        uVar20 = uVar20 + 1;
                      }
                    }
                    else if (ctxt->replaceEntities == 0) {
                      local_44 = xmlStrlen(pxVar11->name);
                      pxVar10 = pxVar11->name;
                      if (((pxVar11->etype != XML_INTERNAL_PREDEFINED_ENTITY) &&
                          (pxVar13 = pxVar11->content, pxVar13 != (xmlChar *)0x0)) &&
                         (pxVar11->checked == 0)) {
                        uVar12 = ctxt->nbentities;
                        ctxt->depth = ctxt->depth + 1;
                        iVar23 = xmlStrlen(pxVar13);
                        pxVar13 = xmlStringLenDecodeEntities(ctxt,pxVar13,iVar23,1,'\0','\0','\0');
                        ctxt->depth = ctxt->depth + -1;
                        uVar17 = (ctxt->nbentities - uVar12) + 1;
                        if (0x3ffffffe < uVar17) {
                          uVar17 = 0x3fffffff;
                        }
                        pxVar11->checked = (int)uVar17 * 2;
                        if (pxVar13 == (xmlChar *)0x0) {
                          *pxVar11->content = '\0';
                        }
                        else {
                          pxVar14 = xmlStrchr(pxVar13,'<');
                          if (pxVar14 != (xmlChar *)0x0) {
                            *(byte *)&pxVar11->checked = (byte)pxVar11->checked | 1;
                          }
                          (*xmlFree)(pxVar13);
                        }
                      }
                      lVar29 = uVar20 + 1;
                      pxVar9[uVar20] = '&';
                      lVar22 = (long)local_44;
                      local_38 = lVar22 + 10;
                      pxVar13 = pxVar9;
                      while (pxVar9 = pxVar13, sVar26 < lVar22 + uVar20 + 0xb) {
                        uVar17 = local_38 + sVar26 * 2;
                        if ((uVar17 < sVar26) ||
                           (pxVar13 = (xmlChar *)(*xmlRealloc)(pxVar9,uVar17), sVar26 = uVar17,
                           pxVar13 == (xmlChar *)0x0)) goto LAB_001597a6;
                      }
                      if (0 < local_44) {
                        uVar7 = local_44 + 1;
                        do {
                          xVar2 = *pxVar10;
                          pxVar10 = pxVar10 + 1;
                          pxVar9[lVar29] = xVar2;
                          lVar29 = lVar29 + 1;
                          uVar7 = uVar7 - 1;
                        } while (1 < uVar7);
                      }
                      pxVar9[lVar29] = ';';
                      uVar20 = lVar29 + 1;
                    }
                    else {
                      ctxt->depth = ctxt->depth + 1;
                      bVar3 = false;
                      local_60 = xmlStringDecodeEntities(ctxt,pxVar11->content,1,'\0','\0','\0');
                      ctxt->depth = ctxt->depth + -1;
                      pbVar24 = local_60;
                      pxVar10 = pxVar9;
                      if (local_60 != (byte *)0x0) {
                        while( true ) {
                          pxVar9 = pxVar10;
                          bVar1 = *pbVar24;
                          bVar15 = 0x20;
                          if (((1 < bVar1 - 9) && (bVar1 != 0xd)) && (bVar15 = bVar1, bVar1 == 0))
                          break;
                          pxVar9[uVar20] = bVar15;
                          uVar17 = uVar20 + 1;
                          pbVar24 = pbVar24 + 1;
                          uVar27 = uVar20 + 0xb;
                          uVar20 = uVar17;
                          pxVar10 = pxVar9;
                          if ((sVar26 < uVar27) &&
                             ((uVar17 = sVar26 * 2 + 10, uVar17 < sVar26 ||
                              (pxVar10 = (xmlChar *)(*xmlRealloc)(pxVar9,uVar17), sVar26 = uVar17,
                              pxVar10 == (xmlChar *)0x0)))) goto LAB_001597a6;
                        }
                        (*xmlFree)(local_60);
                        goto LAB_001593c2;
                      }
                    }
                  }
                  bVar3 = false;
                }
              }
              else {
LAB_001591e5:
                if (local_54 == 1) {
                  pxVar9[uVar20] = (xmlChar)uVar7;
                  uVar20 = uVar20 + 1;
                }
                else {
                  iVar23 = xmlCopyCharMultiByte(pxVar9 + uVar20,uVar7);
                  uVar20 = uVar20 + (long)iVar23;
                }
                if (sVar26 < uVar20 + 10) {
                  uVar17 = sVar26 * 2 + 10;
                  if (uVar17 < sVar26) goto LAB_001597a6;
                  pxVar10 = (xmlChar *)(*xmlRealloc)(pxVar9,uVar17);
                  if (pxVar10 == (xmlChar *)0x0) {
LAB_001598f0:
                    local_60 = (byte *)0x0;
                    goto LAB_001597a6;
                  }
                  bVar3 = false;
                  pxVar9 = pxVar10;
                  sVar26 = uVar17;
                }
                else {
                  bVar3 = false;
                }
LAB_00159394:
                pxVar8 = ctxt->input;
                if (*pxVar8->cur == '\n') {
                  pxVar8->line = pxVar8->line + 1;
                  pxVar8->col = 1;
                }
                else {
                  pxVar8->col = pxVar8->col + 1;
                }
                pxVar8->cur = pxVar8->cur + local_54;
              }
LAB_001593c2:
              if ((ctxt->progressive == 0) &&
                 ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
                xmlGROW(ctxt);
              }
              uVar7 = xmlCurrentChar(ctxt,&local_54);
            } while (uVar20 <= local_50);
            xmlFatalErrMsg(ctxt,XML_ERR_ATTRIBUTE_NOT_FINISHED,"AttValue length too long\n");
          }
          local_60 = (byte *)0x0;
LAB_001597a6:
          xmlErrMemory(ctxt,(char *)0x0);
LAB_001597b5:
          if (pxVar9 != (xmlChar *)0x0) {
            (*xmlFree)(pxVar9);
          }
          if (local_60 == (byte *)0x0) {
            return (xmlChar *)0x0;
          }
          (*xmlFree)(local_60);
          return (xmlChar *)0x0;
        }
        if (xVar28 == '\'') {
          xVar28 = '\'';
          goto LAB_00159031;
        }
        goto LAB_00159742;
      }
    }
LAB_00158fc5:
    xmlFatalErrMsg(ctxt,XML_ERR_ATTRIBUTE_NOT_FINISHED,"AttValue length too long\n");
  }
  else {
LAB_00159742:
    xmlFatalErr(ctxt,XML_ERR_ATTRIBUTE_NOT_STARTED,(char *)0x0);
  }
  return (xmlChar *)0x0;
  while (uVar20 = uVar20 - 1, uVar20 != 0) {
LAB_001597fd:
    if (pxVar9[uVar20 - 1] != ' ') goto LAB_00159839;
  }
  uVar20 = 0;
LAB_00159839:
  pxVar9[uVar20] = '\0';
  xVar2 = *ctxt->input->cur;
  if (xVar2 == '<') {
    xmlFatalErr(ctxt,XML_ERR_LT_IN_ATTRIBUTE,(char *)0x0);
    goto LAB_00159898;
  }
  if (xVar28 == xVar2) {
    xmlNextChar(ctxt);
    goto LAB_00159898;
  }
  if (uVar7 == 0) {
LAB_00159887:
    msg = "AttValue: \' expected\n";
    error = XML_ERR_ATTRIBUTE_NOT_FINISHED;
  }
  else {
    if ((int)uVar7 < 0x100) {
      if ((0x1f < (int)uVar7) || ((uVar7 < 0xe && ((0x2600U >> (uVar7 & 0x1f) & 1) != 0))))
      goto LAB_00159887;
    }
    else if (uVar7 - 0x10000 < 0x100000 || (uVar7 - 0xe000 < 0x1ffe || uVar7 < 0xd800))
    goto LAB_00159887;
    msg = "invalid character in attribute value\n";
    error = XML_ERR_INVALID_CHAR;
  }
  xmlFatalErrMsg(ctxt,error,msg);
LAB_00159898:
  if (piVar5 != (int *)0x0) {
    *piVar5 = (int)uVar20;
    return pxVar9;
  }
  return pxVar9;
}

Assistant:

static xmlChar *
xmlParseAttValueInternal(xmlParserCtxtPtr ctxt, int *len, int *alloc,
                         int normalize)
{
    xmlChar limit = 0;
    const xmlChar *in = NULL, *start, *end, *last;
    xmlChar *ret = NULL;
    int line, col;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_HUGE_LENGTH :
                    XML_MAX_TEXT_LENGTH;

    GROW;
    in = (xmlChar *) CUR_PTR;
    line = ctxt->input->line;
    col = ctxt->input->col;
    if (*in != '"' && *in != '\'') {
        xmlFatalErr(ctxt, XML_ERR_ATTRIBUTE_NOT_STARTED, NULL);
        return (NULL);
    }
    ctxt->instate = XML_PARSER_ATTRIBUTE_VALUE;

    /*
     * try to handle in this routine the most common case where no
     * allocation of a new string is required and where content is
     * pure ASCII.
     */
    limit = *in++;
    col++;
    end = ctxt->input->end;
    start = in;
    if (in >= end) {
        GROW_PARSE_ATT_VALUE_INTERNAL(ctxt, in, start, end)
    }
    if (normalize) {
        /*
	 * Skip any leading spaces
	 */
	while ((in < end) && (*in != limit) &&
	       ((*in == 0x20) || (*in == 0x9) ||
	        (*in == 0xA) || (*in == 0xD))) {
	    if (*in == 0xA) {
	        line++; col = 1;
	    } else {
	        col++;
	    }
	    in++;
	    start = in;
	    if (in >= end) {
                GROW_PARSE_ATT_VALUE_INTERNAL(ctxt, in, start, end)
                if ((in - start) > maxLength) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                                   "AttValue length too long\n");
                    return(NULL);
                }
	    }
	}
	while ((in < end) && (*in != limit) && (*in >= 0x20) &&
	       (*in <= 0x7f) && (*in != '&') && (*in != '<')) {
	    col++;
	    if ((*in++ == 0x20) && (*in == 0x20)) break;
	    if (in >= end) {
                GROW_PARSE_ATT_VALUE_INTERNAL(ctxt, in, start, end)
                if ((in - start) > maxLength) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                                   "AttValue length too long\n");
                    return(NULL);
                }
	    }
	}
	last = in;
	/*
	 * skip the trailing blanks
	 */
	while ((last[-1] == 0x20) && (last > start)) last--;
	while ((in < end) && (*in != limit) &&
	       ((*in == 0x20) || (*in == 0x9) ||
	        (*in == 0xA) || (*in == 0xD))) {
	    if (*in == 0xA) {
	        line++, col = 1;
	    } else {
	        col++;
	    }
	    in++;
	    if (in >= end) {
		const xmlChar *oldbase = ctxt->input->base;
		GROW;
                if (ctxt->instate == XML_PARSER_EOF)
                    return(NULL);
		if (oldbase != ctxt->input->base) {
		    ptrdiff_t delta = ctxt->input->base - oldbase;
		    start = start + delta;
		    in = in + delta;
		    last = last + delta;
		}
		end = ctxt->input->end;
                if ((in - start) > maxLength) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                                   "AttValue length too long\n");
                    return(NULL);
                }
	    }
	}
        if ((in - start) > maxLength) {
            xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                           "AttValue length too long\n");
            return(NULL);
        }
	if (*in != limit) goto need_complex;
    } else {
	while ((in < end) && (*in != limit) && (*in >= 0x20) &&
	       (*in <= 0x7f) && (*in != '&') && (*in != '<')) {
	    in++;
	    col++;
	    if (in >= end) {
                GROW_PARSE_ATT_VALUE_INTERNAL(ctxt, in, start, end)
                if ((in - start) > maxLength) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                                   "AttValue length too long\n");
                    return(NULL);
                }
	    }
	}
	last = in;
        if ((in - start) > maxLength) {
            xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                           "AttValue length too long\n");
            return(NULL);
        }
	if (*in != limit) goto need_complex;
    }
    in++;
    col++;
    if (len != NULL) {
        if (alloc) *alloc = 0;
        *len = last - start;
        ret = (xmlChar *) start;
    } else {
        if (alloc) *alloc = 1;
        ret = xmlStrndup(start, last - start);
    }
    CUR_PTR = in;
    ctxt->input->line = line;
    ctxt->input->col = col;
    return ret;
need_complex:
    if (alloc) *alloc = 1;
    return xmlParseAttValueComplex(ctxt, len, normalize);
}